

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O0

bool __thiscall
helics::InterfaceInfo::setEndpointProperty
          (InterfaceInfo *this,InterfaceHandle hid,int32_t option,int32_t value)

{
  EndpointInfo *this_00;
  int32_t in_ECX;
  int32_t in_EDX;
  EndpointInfo *ept;
  
  this_00 = getEndpoint((InterfaceInfo *)ept,(InterfaceHandle)option);
  if (this_00 != (EndpointInfo *)0x0) {
    EndpointInfo::setProperty(this_00,in_EDX,in_ECX);
    EndpointInfo::setProperty(this_00,in_EDX,in_ECX);
  }
  return this_00 != (EndpointInfo *)0x0;
}

Assistant:

bool InterfaceInfo::setEndpointProperty(InterfaceHandle hid, int32_t option, int32_t value)
{
    auto* ept = getEndpoint(hid);
    if (ept == nullptr) {
        return false;
    }
    ept->setProperty(option, value);
    ept->setProperty(option, value);
    return true;
}